

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_inquire_(Integer *g_a,Integer *type,Integer *dim1,Integer *dim2)

{
  Integer IVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Integer *in_RSI;
  Integer ndim;
  Integer dims [2];
  Integer in_stack_00000158;
  char *in_stack_00000160;
  Integer *in_stack_000001c8;
  Integer *in_stack_000001d0;
  Integer *in_stack_000001d8;
  Integer in_stack_000001e0;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  pnga_inquire(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
  if (local_40 != 2) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  IVar1 = pnga_type_c2f(*in_RSI);
  *in_RSI = IVar1;
  *in_RDX = local_38;
  *in_RCX = local_30;
  return;
}

Assistant:

void FATR ga_inquire_(Integer *g_a, Integer *type, Integer *dim1, Integer *dim2)
{
  Integer dims[2], ndim;
  wnga_inquire(*g_a, type, &ndim, dims);
  if (ndim != 2) wnga_error("Wrong array dimension in ga_inquire",ndim);
  *type = pnga_type_c2f(*type);
  *dim1 = dims[0];
  *dim2 = dims[1];
}